

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCast::Operation<float,int>(float input,int32_t *result,bool strict)

{
  bool bVar1;
  float fVar2;
  
  bVar1 = Value::IsFinite<float>(input);
  if (bVar1) {
    bVar1 = false;
    if ((-2.1474836e+09 <= input) && (bVar1 = false, input < 2.1474836e+09)) {
      fVar2 = nearbyintf(input);
      *result = (int)fVar2;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, int32_t &result, bool strict) {
	return NumericTryCast::Operation<float, int32_t>(input, result, strict);
}